

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall
pbrt::Disk::Sample(Disk *this,ShapeSampleContext *ctx,Point2f u)

{
  Float FVar1;
  Point3<float> p;
  undefined1 auVar2 [16];
  Vector3<float> v;
  Normal3<float> n;
  Point3<float> p2;
  undefined1 auVar3 [16];
  Point3<float> p1;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Point2f u_00;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar8;
  ShapeSample *pSVar9;
  long in_RDX;
  optional<pbrt::ShapeSample> *in_RDI;
  float fVar10;
  type tVar11;
  undefined8 uVar13;
  undefined1 in_ZMM0 [64];
  undefined8 uVar14;
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  Point3f PVar16;
  Vector3<float> VVar17;
  Vector3f wi;
  optional<pbrt::ShapeSample> ss;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 uVar19;
  undefined4 in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  float in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  float in_stack_fffffffffffffd14;
  Tuple3<pbrt::Vector3,_float> v_00;
  undefined1 in_stack_fffffffffffffd18 [16];
  undefined8 in_stack_fffffffffffffd28;
  float in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd50;
  Disk *in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  undefined1 auVar15 [56];
  
  v_00 = in_stack_fffffffffffffd18._0_12_;
  vmovlpd_avx(in_ZMM0._0_16_);
  u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffe5c;
  u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffe58;
  Sample(in_stack_fffffffffffffe50,u_00);
  FVar1 = *(Float *)(in_RDX + 0x30);
  pSVar9 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x8dbee0);
  uVar13 = 0;
  (pSVar9->intr).time = FVar1;
  pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x8dbf0d);
  PVar16 = Interaction::p((Interaction *)
                          CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  uVar14 = 0;
  auVar7._8_8_ = uVar13;
  auVar7._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  vmovlpd_avx(auVar7);
  PVar16 = ShapeSampleContext::p
                     ((ShapeSampleContext *)
                      CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  auVar6._8_8_ = uVar14;
  auVar6._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  vmovlpd_avx(auVar6);
  uVar13 = 0;
  p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffcf4;
  p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffcf0;
  p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffcf8;
  VVar17 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                      ,p);
  auVar5._8_8_ = uVar13;
  auVar5._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  vmovlpd_avx(auVar5);
  VVar17.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffce0;
  VVar17.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffcdc;
  VVar17.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffce4;
  fVar10 = LengthSquared<float>(VVar17);
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    uVar13 = 0;
    VVar17 = Normalize<float>(v_00);
    uVar14 = 0;
    auVar4._8_8_ = uVar13;
    auVar4._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    vmovlpd_avx(auVar4);
    pSVar9 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x8dc20e);
    VVar17 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0));
    auVar3._8_8_ = uVar14;
    auVar3._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    vmovlpd_avx(auVar3);
    n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffd30;
    n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffffd28;
    n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
    v.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffd10;
    v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffd0c;
    v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffd14;
    tVar11 = AbsDot<float>(n,v);
    auVar15 = extraout_var;
    PVar16 = ShapeSampleContext::p
                       ((ShapeSampleContext *)
                        CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    fVar10 = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
    auVar12._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar15;
    uVar13 = 0;
    vmovlpd_avx(auVar12._0_16_);
    pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x8dc35e);
    PVar16 = Interaction::p((Interaction *)CONCAT44(fVar10,in_stack_fffffffffffffd10));
    auVar2._8_8_ = uVar13;
    auVar2._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
    vmovlpd_avx(auVar2);
    p1.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffd50;
    p1.super_Tuple3<pbrt::Point3,_float>._0_8_ = pSVar9;
    p2.super_Tuple3<pbrt::Point3,_float>.z = tVar11;
    p2.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffd28;
    p2.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
    fVar10 = DistanceSquared<float>(p1,p2);
    fVar10 = tVar11 / fVar10;
    pSVar9 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x8dc449);
    pSVar9->pdf = pSVar9->pdf / fVar10;
    pSVar9 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x8dc476);
    uVar18 = SUB84(pSVar9,0);
    uVar19 = (undefined4)((ulong)pSVar9 >> 0x20);
    eVar8 = IsInf<float>(0.0);
    if (eVar8) {
      memset(in_RDI,0,0x60);
      pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
    }
    else {
      pstd::optional<pbrt::ShapeSample>::optional
                ((optional<pbrt::ShapeSample> *)CONCAT44(fVar10,in_stack_fffffffffffffce0),
                 (optional<pbrt::ShapeSample> *)CONCAT44(uVar19,uVar18));
    }
  }
  else {
    memset(in_RDI,0,0x60);
    pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
  }
  pstd::optional<pbrt::ShapeSample>::~optional((optional<pbrt::ShapeSample> *)0x8dc4f9);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Sample shape by area and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert area sampling PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }